

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void pack_pixels(__m256i *s,__m256i *p)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i c;
  __m256i sf1;
  __m256i sf0;
  __m256i idx;
  
  auVar2._8_4_ = 4;
  auVar2._12_4_ = 5;
  auVar2._0_4_ = 2;
  auVar2._4_4_ = 3;
  auVar2._16_4_ = 2;
  auVar2._20_4_ = 3;
  auVar2._24_4_ = 4;
  auVar2._28_4_ = 5;
  auVar2 = vpermd_avx2(auVar2,*in_RDI);
  auVar5[8] = '\x04';
  auVar5[9] = '\x05';
  auVar5[10] = '\x06';
  auVar5[0xb] = '\a';
  auVar5[0xc] = '\x06';
  auVar5[0xd] = '\a';
  auVar5[0xe] = '\b';
  auVar5[0xf] = '\t';
  auVar5[0] = '\0';
  auVar5[1] = '\x01';
  auVar5[2] = '\x02';
  auVar5[3] = '\x03';
  auVar5[4] = '\x02';
  auVar5[5] = '\x03';
  auVar5[6] = '\x04';
  auVar5[7] = '\x05';
  auVar5[0x10] = '\0';
  auVar5[0x11] = '\x01';
  auVar5[0x12] = '\x02';
  auVar5[0x13] = '\x03';
  auVar5[0x14] = '\x02';
  auVar5[0x15] = '\x03';
  auVar5[0x16] = '\x04';
  auVar5[0x17] = '\x05';
  auVar5[0x18] = '\x04';
  auVar5[0x19] = '\x05';
  auVar5[0x1a] = '\x06';
  auVar5[0x1b] = '\a';
  auVar5[0x1c] = '\x06';
  auVar5[0x1d] = '\a';
  auVar5[0x1e] = '\b';
  auVar5[0x1f] = '\t';
  auVar1 = vpshufb_avx2(*in_RDI,auVar5);
  *in_RSI = auVar1;
  auVar4[8] = '\b';
  auVar4[9] = '\t';
  auVar4[10] = '\n';
  auVar4[0xb] = '\v';
  auVar4[0xc] = '\n';
  auVar4[0xd] = '\v';
  auVar4[0xe] = '\f';
  auVar4[0xf] = '\r';
  auVar4[0] = '\x04';
  auVar4[1] = '\x05';
  auVar4[2] = '\x06';
  auVar4[3] = '\a';
  auVar4[4] = '\x06';
  auVar4[5] = '\a';
  auVar4[6] = '\b';
  auVar4[7] = '\t';
  auVar4[0x10] = '\x04';
  auVar4[0x11] = '\x05';
  auVar4[0x12] = '\x06';
  auVar4[0x13] = '\a';
  auVar4[0x14] = '\x06';
  auVar4[0x15] = '\a';
  auVar4[0x16] = '\b';
  auVar4[0x17] = '\t';
  auVar4[0x18] = '\b';
  auVar4[0x19] = '\t';
  auVar4[0x1a] = '\n';
  auVar4[0x1b] = '\v';
  auVar4[0x1c] = '\n';
  auVar4[0x1d] = '\v';
  auVar4[0x1e] = '\f';
  auVar4[0x1f] = '\r';
  auVar1 = vpshufb_avx2(*in_RDI,auVar4);
  in_RSI[1] = auVar1;
  auVar3[8] = '\x04';
  auVar3[9] = '\x05';
  auVar3[10] = '\x06';
  auVar3[0xb] = '\a';
  auVar3[0xc] = '\x06';
  auVar3[0xd] = '\a';
  auVar3[0xe] = '\b';
  auVar3[0xf] = '\t';
  auVar3[0] = '\0';
  auVar3[1] = '\x01';
  auVar3[2] = '\x02';
  auVar3[3] = '\x03';
  auVar3[4] = '\x02';
  auVar3[5] = '\x03';
  auVar3[6] = '\x04';
  auVar3[7] = '\x05';
  auVar3[0x10] = '\0';
  auVar3[0x11] = '\x01';
  auVar3[0x12] = '\x02';
  auVar3[0x13] = '\x03';
  auVar3[0x14] = '\x02';
  auVar3[0x15] = '\x03';
  auVar3[0x16] = '\x04';
  auVar3[0x17] = '\x05';
  auVar3[0x18] = '\x04';
  auVar3[0x19] = '\x05';
  auVar3[0x1a] = '\x06';
  auVar3[0x1b] = '\a';
  auVar3[0x1c] = '\x06';
  auVar3[0x1d] = '\a';
  auVar3[0x1e] = '\b';
  auVar3[0x1f] = '\t';
  auVar1 = vpshufb_avx2(auVar2,auVar3);
  in_RSI[2] = auVar1;
  auVar1[8] = '\b';
  auVar1[9] = '\t';
  auVar1[10] = '\n';
  auVar1[0xb] = '\v';
  auVar1[0xc] = '\n';
  auVar1[0xd] = '\v';
  auVar1[0xe] = '\f';
  auVar1[0xf] = '\r';
  auVar1[0] = '\x04';
  auVar1[1] = '\x05';
  auVar1[2] = '\x06';
  auVar1[3] = '\a';
  auVar1[4] = '\x06';
  auVar1[5] = '\a';
  auVar1[6] = '\b';
  auVar1[7] = '\t';
  auVar1[0x10] = '\x04';
  auVar1[0x11] = '\x05';
  auVar1[0x12] = '\x06';
  auVar1[0x13] = '\a';
  auVar1[0x14] = '\x06';
  auVar1[0x15] = '\a';
  auVar1[0x16] = '\b';
  auVar1[0x17] = '\t';
  auVar1[0x18] = '\b';
  auVar1[0x19] = '\t';
  auVar1[0x1a] = '\n';
  auVar1[0x1b] = '\v';
  auVar1[0x1c] = '\n';
  auVar1[0x1d] = '\v';
  auVar1[0x1e] = '\f';
  auVar1[0x1f] = '\r';
  auVar1 = vpshufb_avx2(auVar2,auVar1);
  in_RSI[3] = auVar1;
  return;
}

Assistant:

static inline void pack_pixels(const __m256i *s, __m256i *p /*p[4]*/) {
  const __m256i idx = _mm256_loadu_si256((const __m256i *)signal_index);
  const __m256i sf0 = _mm256_loadu_si256((const __m256i *)signal_pattern_0);
  const __m256i sf1 = _mm256_loadu_si256((const __m256i *)signal_pattern_1);
  const __m256i c = _mm256_permutevar8x32_epi32(*s, idx);

  p[0] = _mm256_shuffle_epi8(*s, sf0);  // x0x6
  p[1] = _mm256_shuffle_epi8(*s, sf1);  // x1x7
  p[2] = _mm256_shuffle_epi8(c, sf0);   // x2x4
  p[3] = _mm256_shuffle_epi8(c, sf1);   // x3x5
}